

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O2

vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_> *
__thiscall
rcg::System::getInterfaces
          (vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
           *__return_storage_ptr__,System *this)

{
  shared_ptr<const_rcg::GenTLWrapper> *gentl;
  vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_> *pvVar1
  ;
  __type _Var2;
  GC_ERROR GVar3;
  string *__lhs;
  Interface *this_00;
  pointer psVar4;
  GenTLException *pGVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar6;
  undefined8 extraout_RDX_01;
  uint uVar7;
  pointer __file;
  size_t i;
  ulong uVar8;
  size_t i_1;
  long lVar9;
  uint32_t n;
  vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_> current
  ;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
  *local_158;
  __shared_ptr<rcg::System,(__gnu_cxx::_Lock_policy)2> local_150 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_148;
  size_t size;
  char tmp [256];
  
  std::recursive_mutex::lock(&this->mtx);
  pvVar1 = &this->ilist;
  std::vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>::
  vector(__return_storage_ptr__,pvVar1);
  if ((this->tl != (TL_HANDLE)0x0) &&
     ((this->ilist).
      super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->ilist).
      super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    current.
    super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    current.
    super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    current.
    super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GVar3 = (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->TLUpdateInterfaceList)(this->tl,(bool8_t *)0x0,10);
    gentl = &this->gentl;
    if (GVar3 != 0) {
      pGVar5 = (GenTLException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)tmp,"System::getInterfaces()",(allocator *)&local_178);
      GenTLException::GenTLException(pGVar5,(string *)tmp,gentl);
      __cxa_throw(pGVar5,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
    n = 0;
    GVar3 = (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->TLGetNumInterfaces)(this->tl,&n);
    local_158 = pvVar1;
    if (GVar3 != 0) {
      pGVar5 = (GenTLException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)tmp,"System::getInterfaces()",(allocator *)&local_178);
      GenTLException::GenTLException(pGVar5,(string *)tmp,gentl);
      __cxa_throw(pGVar5,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
    for (uVar7 = 0; pvVar1 = local_158, uVar7 < n; uVar7 = uVar7 + 1) {
      memset(tmp,0,0x100);
      size = 0x100;
      GVar3 = (*((this->gentl).
                 super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                TLGetInterfaceID)(this->tl,uVar7,tmp,&size);
      if (GVar3 != 0) {
        pGVar5 = (GenTLException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_178,"System::getInterfaces()",(allocator *)local_150);
        GenTLException::GenTLException(pGVar5,&local_178,gentl);
        __cxa_throw(pGVar5,&GenTLException::typeinfo,GenTLException::~GenTLException);
      }
      std::__cxx11::string::string((string *)&local_178,tmp,(allocator *)local_150);
      lVar9 = 0;
      for (uVar8 = 0;
          uVar8 < (ulong)((long)current.
                                super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)current.
                                super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4); uVar8 = uVar8 + 1)
      {
        __lhs = Interface::getID_abi_cxx11_
                          (*(Interface **)
                            ((long)&((current.
                                      super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>).
                                    _M_ptr + lVar9));
        _Var2 = std::operator==(__lhs,&local_178);
        if (_Var2) goto LAB_0010c584;
        lVar9 = lVar9 + 0x10;
      }
      uVar8 = 0xffffffff;
LAB_0010c584:
      std::__cxx11::string::~string((string *)&local_178);
      if ((int)uVar8 < 0) {
        this_00 = (Interface *)operator_new(0xc0);
        std::__shared_ptr<rcg::System,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<rcg::System,void>
                  (local_150,(__weak_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2> *)this);
        Interface::Interface(this_00,(shared_ptr<rcg::System> *)local_150,gentl,tmp);
        std::__shared_ptr<rcg::Interface,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<rcg::Interface,void>
                  ((__shared_ptr<rcg::Interface,(__gnu_cxx::_Lock_policy)2> *)&local_178,this_00);
        std::vector<std::shared_ptr<rcg::Interface>,std::allocator<std::shared_ptr<rcg::Interface>>>
        ::emplace_back<std::shared_ptr<rcg::Interface>>
                  ((vector<std::shared_ptr<rcg::Interface>,std::allocator<std::shared_ptr<rcg::Interface>>>
                    *)__return_storage_ptr__,(shared_ptr<rcg::Interface> *)&local_178);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_178._M_string_length);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_148);
      }
      else {
        std::
        vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>::
        push_back(__return_storage_ptr__,
                  current.
                  super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (uVar8 & 0xffffffff));
      }
    }
    std::vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
    ::clear(local_158);
    lVar9 = 0;
    uVar8 = 0;
    uVar6 = extraout_RDX;
    while( true ) {
      __file = (__return_storage_ptr__->
               super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      psVar4 = (__return_storage_ptr__->
               super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if ((ulong)((long)psVar4 - (long)__file >> 4) <= uVar8) break;
      std::
      vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>::
      push_back(pvVar1,(value_type *)
                       ((long)&(__file->
                               super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr + lVar9));
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x10;
      uVar6 = extraout_RDX_00;
    }
    lVar9 = 0;
    for (uVar8 = 0; uVar8 < (ulong)((long)psVar4 - (long)__file >> 4); uVar8 = uVar8 + 1) {
      Interface::open(*(Interface **)
                       ((long)&(__file->
                               super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr + lVar9),(char *)__file,(int)uVar6);
      __file = (__return_storage_ptr__->
               super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      psVar4 = (__return_storage_ptr__->
               super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      lVar9 = lVar9 + 0x10;
      uVar6 = extraout_RDX_01;
    }
    std::vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
    ::~vector(&current);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::shared_ptr<Interface> > System::getInterfaces()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);
  std::vector<std::shared_ptr<Interface> > ret=ilist;

  // ENUM-WORKAROUND: Interfaces are only enumerated once and kept open as a
  // (temporary) workaround for a bug in the Baumer GenTL layer 2.1.0 for GEV
  // that is used by default. The bug causes memory and CPU time to
  // increase on every call of TLUpdateInterfaceList().

  if (tl != 0 && ilist.size() == 0)
  {
    // get list of previously requested interfaces that are still in use

    std::vector<std::shared_ptr<Interface> > current;

/*
    for (size_t i=0; i<ilist.size(); i++)
    {
      std::shared_ptr<Interface> p=ilist[i].lock();
      if (p)
      {
        current.push_back(p);
      }
    }
*/

    // update available interfaces

    if (gentl->TLUpdateInterfaceList(tl, 0, 10) != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("System::getInterfaces()", gentl);
    }

    // create list of interfaces, using either existing interfaces or
    // instantiating new ones

    uint32_t n=0;
    if (gentl->TLGetNumInterfaces(tl, &n) != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("System::getInterfaces()", gentl);
    }

    for (uint32_t i=0; i<n; i++)
    {
      char tmp[256]="";
      size_t size=sizeof(tmp);

      if (gentl->TLGetInterfaceID(tl, i, tmp, &size) != GenTL::GC_ERR_SUCCESS)
      {
        throw GenTLException("System::getInterfaces()", gentl);
      }

      int k=find(current, tmp);

      if (k >= 0)
      {
        ret.push_back(current[static_cast<size_t>(k)]);
      }
      else
      {
        ret.push_back(std::shared_ptr<Interface>(new Interface(shared_from_this(), gentl, tmp)));
      }
    }

    // update internal list of interfaces for reusage on next call

    ilist.clear();
    for (size_t i=0; i<ret.size(); i++)
    {
      ilist.push_back(ret[i]);
    }

    // open interfaces to avoid re-enumeration as part of ENUM-WORKAROUND

    for (size_t i=0; i<ret.size(); i++)
    {
      ret[i]->open();
    }
  }

  return ret;
}